

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcarith.c
# Opt level: O1

boolean encode_mcu(j_compress_ptr cinfo,JBLOCKROW *MCU_data)

{
  int iVar1;
  jpeg_entropy_encoder *pjVar2;
  JBLOCKROW paJVar3;
  jpeg_component_info *pjVar4;
  bool bVar5;
  uint uVar6;
  short sVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  int *piVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  _func_void_j_compress_ptr *p_Var17;
  _func_boolean_j_compress_ptr_JBLOCKROW_ptr *p_Var18;
  undefined4 uVar19;
  
  pjVar2 = cinfo->entropy;
  if (cinfo->restart_interval != 0) {
    if (*(int *)&pjVar2[4].start_pass == 0) {
      emit_restart(cinfo,*(int *)((long)&pjVar2[4].start_pass + 4));
      *(uint *)&pjVar2[4].start_pass = cinfo->restart_interval;
      *(uint *)((long)&pjVar2[4].start_pass + 4) =
           *(int *)((long)&pjVar2[4].start_pass + 4) + 1U & 7;
    }
    *(int *)&pjVar2[4].start_pass = *(int *)&pjVar2[4].start_pass + -1;
  }
  if (0 < cinfo->blocks_in_MCU) {
    lVar8 = 0;
    do {
      paJVar3 = MCU_data[lVar8];
      lVar15 = (long)cinfo->MCU_membership[lVar8];
      pjVar4 = cinfo->cur_comp_info[lVar15];
      iVar1 = pjVar4->dc_tbl_no;
      p_Var18 = (&pjVar2[4].encode_mcu)[iVar1] + *(int *)((long)&pjVar2[3].encode_mcu + lVar15 * 4);
      iVar12 = (int)(*paJVar3)[0] - *(int *)((long)&pjVar2[2].finish_pass + lVar15 * 4);
      if (iVar12 == 0) {
        arith_encode(cinfo,(uchar *)p_Var18,0);
        *(undefined4 *)((long)&pjVar2[3].encode_mcu + lVar15 * 4) = 0;
      }
      else {
        *(int *)((long)&pjVar2[2].finish_pass + lVar15 * 4) = (int)(*paJVar3)[0];
        arith_encode(cinfo,(uchar *)p_Var18,1);
        uVar9 = 0;
        bVar5 = iVar12 < 1;
        if (bVar5) {
          iVar12 = -iVar12;
          uVar19 = 8;
          lVar16 = 3;
        }
        else {
          uVar19 = 4;
          lVar16 = 2;
        }
        arith_encode(cinfo,(uchar *)(p_Var18 + 1),(uint)bVar5);
        p_Var18 = p_Var18 + lVar16;
        *(undefined4 *)((long)&pjVar2[3].encode_mcu + lVar15 * 4) = uVar19;
        uVar13 = iVar12 - 1;
        if (uVar13 != 0) {
          uVar9 = 1;
          arith_encode(cinfo,(uchar *)p_Var18,1);
          p_Var18 = (&pjVar2[4].encode_mcu)[iVar1] + 0x14;
          if (uVar13 != 1) {
            uVar9 = 1;
            uVar10 = uVar13;
            do {
              arith_encode(cinfo,(uchar *)p_Var18,1);
              uVar9 = uVar9 * 2;
              p_Var18 = p_Var18 + 1;
              bVar5 = 3 < uVar10;
              uVar10 = uVar10 >> 1;
            } while (bVar5);
          }
        }
        iVar12 = 0;
        arith_encode(cinfo,(uchar *)p_Var18,0);
        if ((int)uVar9 < (int)((ulong)(1L << (cinfo->arith_dc_L[iVar1] & 0x3f)) >> 1)) {
LAB_0012ce7c:
          *(int *)((long)&pjVar2[3].encode_mcu + lVar15 * 4) = iVar12;
        }
        else if ((int)((ulong)(1L << (cinfo->arith_dc_U[iVar1] & 0x3f)) >> 1) < (int)uVar9) {
          iVar12 = *(int *)((long)&pjVar2[3].encode_mcu + lVar15 * 4) + 8;
          goto LAB_0012ce7c;
        }
        if (1 < uVar9) {
          do {
            uVar9 = (int)uVar9 >> 1;
            arith_encode(cinfo,(uchar *)(p_Var18 + 0xe),(uint)((uVar9 & uVar13) != 0));
          } while (1 < uVar9);
        }
      }
      iVar1 = pjVar4->ac_tbl_no;
      uVar9 = 0x40;
      do {
        uVar13 = uVar9 - 1;
        if ((*paJVar3)[jpeg_natural_order[uVar13]] != 0) goto LAB_0012cede;
        uVar9 = uVar9 - 1;
      } while (1 < uVar9);
      uVar13 = 0;
LAB_0012cede:
      if ((int)uVar13 < 1) {
        iVar12 = 1;
      }
      else {
        iVar14 = 1;
        do {
          p_Var17 = (&pjVar2[9].finish_pass)[iVar1] + (iVar14 * 3 + -3);
          arith_encode(cinfo,(uchar *)p_Var17,0);
          sVar7 = (*paJVar3)[jpeg_natural_order[iVar14]];
          if (sVar7 == 0) {
            piVar11 = jpeg_natural_order + (long)iVar14 + 1;
            do {
              arith_encode(cinfo,(uchar *)(p_Var17 + 1),0);
              p_Var17 = p_Var17 + 3;
              sVar7 = (*paJVar3)[*piVar11];
              iVar14 = iVar14 + 1;
              piVar11 = piVar11 + 1;
            } while (sVar7 == 0);
          }
          iVar12 = (int)sVar7;
          arith_encode(cinfo,(uchar *)(p_Var17 + 1),1);
          if (sVar7 < 1) {
            iVar12 = -iVar12;
          }
          arith_encode(cinfo,(uchar *)(pjVar2 + 0xf),(uint)(sVar7 < 1));
          p_Var17 = p_Var17 + 2;
          uVar9 = iVar12 - 1;
          if (uVar9 == 0) {
            uVar10 = 0;
          }
          else {
            uVar10 = 1;
            arith_encode(cinfo,(uchar *)p_Var17,1);
            if (uVar9 != 1) {
              arith_encode(cinfo,(uchar *)p_Var17,1);
              lVar15 = 0xbd;
              if ((int)(uint)cinfo->arith_ac_K[iVar1] < iVar14) {
                lVar15 = 0xd9;
              }
              p_Var17 = (&pjVar2[9].finish_pass)[iVar1] + lVar15;
              uVar10 = 2;
              uVar6 = uVar9;
              while (uVar6 = (int)uVar6 >> 1, 1 < uVar6) {
                arith_encode(cinfo,(uchar *)p_Var17,1);
                uVar10 = uVar10 * 2;
                p_Var17 = p_Var17 + 1;
              }
            }
          }
          arith_encode(cinfo,(uchar *)p_Var17,0);
          if (1 < uVar10) {
            do {
              uVar10 = (int)uVar10 >> 1;
              arith_encode(cinfo,(uchar *)(p_Var17 + 0xe),(uint)((uVar10 & uVar9) != 0));
            } while (1 < uVar10);
          }
          iVar12 = iVar14 + 1;
          bVar5 = iVar14 < (int)uVar13;
          iVar14 = iVar12;
        } while (bVar5);
      }
      if (iVar12 < 0x40) {
        arith_encode(cinfo,(uchar *)((&pjVar2[9].finish_pass)[iVar1] + (iVar12 * 3 + -3)),1);
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < cinfo->blocks_in_MCU);
  }
  return 1;
}

Assistant:

METHODDEF(boolean)
encode_mcu(j_compress_ptr cinfo, JBLOCKROW *MCU_data)
{
  arith_entropy_ptr entropy = (arith_entropy_ptr)cinfo->entropy;
  jpeg_component_info *compptr;
  JBLOCKROW block;
  unsigned char *st;
  int blkn, ci, tbl, k, ke;
  int v, v2, m;

  /* Emit restart marker if needed */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0) {
      emit_restart(cinfo, entropy->next_restart_num);
      entropy->restarts_to_go = cinfo->restart_interval;
      entropy->next_restart_num++;
      entropy->next_restart_num &= 7;
    }
    entropy->restarts_to_go--;
  }

  /* Encode the MCU data blocks */
  for (blkn = 0; blkn < cinfo->blocks_in_MCU; blkn++) {
    block = MCU_data[blkn];
    ci = cinfo->MCU_membership[blkn];
    compptr = cinfo->cur_comp_info[ci];

    /* Sections F.1.4.1 & F.1.4.4.1: Encoding of DC coefficients */

    tbl = compptr->dc_tbl_no;

    /* Table F.4: Point to statistics bin S0 for DC coefficient coding */
    st = entropy->dc_stats[tbl] + entropy->dc_context[ci];

    /* Figure F.4: Encode_DC_DIFF */
    if ((v = (*block)[0] - entropy->last_dc_val[ci]) == 0) {
      arith_encode(cinfo, st, 0);
      entropy->dc_context[ci] = 0;      /* zero diff category */
    } else {
      entropy->last_dc_val[ci] = (*block)[0];
      arith_encode(cinfo, st, 1);
      /* Figure F.6: Encoding nonzero value v */
      /* Figure F.7: Encoding the sign of v */
      if (v > 0) {
        arith_encode(cinfo, st + 1, 0); /* Table F.4: SS = S0 + 1 */
        st += 2;                        /* Table F.4: SP = S0 + 2 */
        entropy->dc_context[ci] = 4;    /* small positive diff category */
      } else {
        v = -v;
        arith_encode(cinfo, st + 1, 1); /* Table F.4: SS = S0 + 1 */
        st += 3;                        /* Table F.4: SN = S0 + 3 */
        entropy->dc_context[ci] = 8;    /* small negative diff category */
      }
      /* Figure F.8: Encoding the magnitude category of v */
      m = 0;
      if (v -= 1) {
        arith_encode(cinfo, st, 1);
        m = 1;
        v2 = v;
        st = entropy->dc_stats[tbl] + 20; /* Table F.4: X1 = 20 */
        while (v2 >>= 1) {
          arith_encode(cinfo, st, 1);
          m <<= 1;
          st += 1;
        }
      }
      arith_encode(cinfo, st, 0);
      /* Section F.1.4.4.1.2: Establish dc_context conditioning category */
      if (m < (int)((1L << cinfo->arith_dc_L[tbl]) >> 1))
        entropy->dc_context[ci] = 0;    /* zero diff category */
      else if (m > (int)((1L << cinfo->arith_dc_U[tbl]) >> 1))
        entropy->dc_context[ci] += 8;   /* large diff category */
      /* Figure F.9: Encoding the magnitude bit pattern of v */
      st += 14;
      while (m >>= 1)
        arith_encode(cinfo, st, (m & v) ? 1 : 0);
    }

    /* Sections F.1.4.2 & F.1.4.4.2: Encoding of AC coefficients */

    tbl = compptr->ac_tbl_no;

    /* Establish EOB (end-of-block) index */
    for (ke = DCTSIZE2 - 1; ke > 0; ke--)
      if ((*block)[jpeg_natural_order[ke]]) break;

    /* Figure F.5: Encode_AC_Coefficients */
    for (k = 1; k <= ke; k++) {
      st = entropy->ac_stats[tbl] + 3 * (k - 1);
      arith_encode(cinfo, st, 0);       /* EOB decision */
      while ((v = (*block)[jpeg_natural_order[k]]) == 0) {
        arith_encode(cinfo, st + 1, 0);  st += 3;  k++;
      }
      arith_encode(cinfo, st + 1, 1);
      /* Figure F.6: Encoding nonzero value v */
      /* Figure F.7: Encoding the sign of v */
      if (v > 0) {
        arith_encode(cinfo, entropy->fixed_bin, 0);
      } else {
        v = -v;
        arith_encode(cinfo, entropy->fixed_bin, 1);
      }
      st += 2;
      /* Figure F.8: Encoding the magnitude category of v */
      m = 0;
      if (v -= 1) {
        arith_encode(cinfo, st, 1);
        m = 1;
        v2 = v;
        if (v2 >>= 1) {
          arith_encode(cinfo, st, 1);
          m <<= 1;
          st = entropy->ac_stats[tbl] +
               (k <= cinfo->arith_ac_K[tbl] ? 189 : 217);
          while (v2 >>= 1) {
            arith_encode(cinfo, st, 1);
            m <<= 1;
            st += 1;
          }
        }
      }
      arith_encode(cinfo, st, 0);
      /* Figure F.9: Encoding the magnitude bit pattern of v */
      st += 14;
      while (m >>= 1)
        arith_encode(cinfo, st, (m & v) ? 1 : 0);
    }
    /* Encode EOB decision only if k <= DCTSIZE2 - 1 */
    if (k <= DCTSIZE2 - 1) {
      st = entropy->ac_stats[tbl] + 3 * (k - 1);
      arith_encode(cinfo, st, 1);
    }
  }

  return TRUE;
}